

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

void rf_draw_line_ex(rf_vec2 start_pos,rf_vec2 end_pos,float thick,rf_color color)

{
  bool bVar1;
  float fVar2;
  float x;
  float local_54;
  uint local_50;
  float angle;
  float d;
  float dy;
  float dx;
  rf_vec2 temp_pos;
  float thick_local;
  rf_color color_local;
  rf_vec2 end_pos_local;
  rf_vec2 start_pos_local;
  
  end_pos_local.x = start_pos.x;
  thick_local = end_pos.x;
  bVar1 = thick_local < end_pos_local.x;
  _thick_local = end_pos;
  end_pos_local = start_pos;
  if (bVar1) {
    _thick_local = start_pos;
    end_pos_local = end_pos;
  }
  fVar2 = (float)color_local - end_pos_local.y;
  x = sqrtf((thick_local - end_pos_local.x) * (thick_local - end_pos_local.x) + fVar2 * fVar2);
  fVar2 = asinf(fVar2 / x);
  rf_get_shapes_texture();
  rf_gfx_enable_texture(local_50);
  rf_gfx_push_matrix();
  rf_gfx_translatef(end_pos_local.x,end_pos_local.y,0.0);
  rf_gfx_rotatef(fVar2 * 57.295776,0.0,0.0,1.0);
  if (thick <= 1.0) {
    local_54 = -1.0;
  }
  else {
    local_54 = -thick / 2.0;
  }
  rf_gfx_translatef(0.0,local_54,0.0);
  rf_gfx_begin(RF_QUADS);
  temp_pos.y._0_1_ = color.r;
  temp_pos.y._1_1_ = color.g;
  temp_pos.y._2_1_ = color.b;
  temp_pos.y._3_1_ = color.a;
  rf_gfx_color4ub(temp_pos.y._0_1_,temp_pos.y._1_1_,temp_pos.y._2_1_,temp_pos.y._3_1_);
  rf_gfx_normal3f(0.0,0.0,1.0);
  rf_gfx_tex_coord2f((rf__ctx->field_0).rec_tex_shapes.x /
                     (float)(rf__ctx->field_0).tex_shapes.width,
                     (rf__ctx->field_0).rec_tex_shapes.y /
                     (float)(rf__ctx->field_0).tex_shapes.height);
  rf_gfx_vertex2f(0.0,0.0);
  rf_gfx_tex_coord2f((rf__ctx->field_0).rec_tex_shapes.x /
                     (float)(rf__ctx->field_0).tex_shapes.width,
                     ((rf__ctx->field_0).rec_tex_shapes.y + (rf__ctx->field_0).rec_tex_shapes.height
                     ) / (float)(rf__ctx->field_0).tex_shapes.height);
  rf_gfx_vertex2f(0.0,thick);
  rf_gfx_tex_coord2f(((rf__ctx->field_0).rec_tex_shapes.x + (rf__ctx->field_0).rec_tex_shapes.width)
                     / (float)(rf__ctx->field_0).tex_shapes.width,
                     ((rf__ctx->field_0).rec_tex_shapes.y + (rf__ctx->field_0).rec_tex_shapes.height
                     ) / (float)(rf__ctx->field_0).tex_shapes.height);
  rf_gfx_vertex2f(x,thick);
  rf_gfx_tex_coord2f(((rf__ctx->field_0).rec_tex_shapes.x + (rf__ctx->field_0).rec_tex_shapes.width)
                     / (float)(rf__ctx->field_0).tex_shapes.width,
                     (rf__ctx->field_0).rec_tex_shapes.y /
                     (float)(rf__ctx->field_0).tex_shapes.height);
  rf_gfx_vertex2f(x,0.0);
  rf_gfx_end();
  rf_gfx_pop_matrix();
  rf_gfx_disable_texture();
  return;
}

Assistant:

RF_API void rf_draw_line_ex(rf_vec2 start_pos, rf_vec2 end_pos, float thick, rf_color color)
{
    if (start_pos.x > end_pos.x)
    {
        rf_vec2 temp_pos = start_pos;
        start_pos = end_pos;
        end_pos = temp_pos;
    }

    float dx = end_pos.x - start_pos.x;
    float dy = end_pos.y - start_pos.y;

    float d = sqrtf(dx*dx + dy*dy);
    float angle = asinf(dy/d);

    rf_gfx_enable_texture(rf_get_shapes_texture().id);

    rf_gfx_push_matrix();
    rf_gfx_translatef((float)start_pos.x, (float)start_pos.y, 0.0f);
    rf_gfx_rotatef(RF_RAD2DEG * angle, 0.0f, 0.0f, 1.0f);
    rf_gfx_translatef(0, (thick > 1.0f)? -thick/2.0f : -1.0f, 0.0f);

    rf_gfx_begin(RF_QUADS);
    rf_gfx_color4ub(color.r, color.g, color.b, color.a);
    rf_gfx_normal3f(0.0f, 0.0f, 1.0f);

    rf_gfx_tex_coord2f(rf_ctx.rec_tex_shapes.x / rf_ctx.tex_shapes.width, rf_ctx.rec_tex_shapes.y / rf_ctx.tex_shapes.height);
    rf_gfx_vertex2f(0.0f, 0.0f);

    rf_gfx_tex_coord2f(rf_ctx.rec_tex_shapes.x / rf_ctx.tex_shapes.width, (rf_ctx.rec_tex_shapes.y + rf_ctx.rec_tex_shapes.height) / rf_ctx.tex_shapes.height);
    rf_gfx_vertex2f(0.0f, thick);

    rf_gfx_tex_coord2f((rf_ctx.rec_tex_shapes.x + rf_ctx.rec_tex_shapes.width) / rf_ctx.tex_shapes.width, (rf_ctx.rec_tex_shapes.y + rf_ctx.rec_tex_shapes.height) / rf_ctx.tex_shapes.height);
    rf_gfx_vertex2f(d, thick);

    rf_gfx_tex_coord2f((rf_ctx.rec_tex_shapes.x + rf_ctx.rec_tex_shapes.width) / rf_ctx.tex_shapes.width, rf_ctx.rec_tex_shapes.y / rf_ctx.tex_shapes.height);
    rf_gfx_vertex2f(d, 0.0f);
    rf_gfx_end();
    rf_gfx_pop_matrix();

    rf_gfx_disable_texture();
}